

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixOpen(unqlite_vfs *pVfs,char *zPath,unqlite_file *pFile,uint flags)

{
  int iVar1;
  unixInodeInfo *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  sxi32 sVar6;
  ulong uVar7;
  unqlite_io_methods *puVar8;
  int *piVar9;
  unqlite_io_methods *puVar10;
  UnixUnusedFd **ppUVar11;
  undefined8 uVar12;
  int iVar13;
  int dirfd;
  bool local_e5;
  int local_e4;
  unqlite_file *local_e0;
  dev_t local_d8;
  ino_t iStack_d0;
  stat local_c8;
  
  local_e4 = -1;
  uVar7 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&pFile->pMethods + uVar7 + 4) = 0;
    uVar7 = uVar7 + 4;
  } while (uVar7 < 0x44);
  iVar4 = stat(zPath,&local_c8);
  puVar2 = inodeList;
  if (iVar4 == 0) {
    for (; puVar2 != (unixInodeInfo *)0x0; puVar2 = puVar2->pNext) {
      if (((puVar2->fileId).dev == local_c8.st_dev) && ((puVar2->fileId).ino == local_c8.st_ino)) {
        puVar8 = (unqlite_io_methods *)puVar2->pUnused;
        if (puVar8 != (unqlite_io_methods *)0x0) {
          if (*(uint *)&puVar8->field_0x4 != flags) goto LAB_0010f8df;
          ppUVar11 = &puVar2->pUnused;
          goto LAB_0010f8f8;
        }
        break;
      }
    }
  }
LAB_0010f679:
  puVar8 = (unqlite_io_methods *)SyMemBackendAlloc(&sUnqlMPGlobal.sAllocator,0x10);
  if (puVar8 == (unqlite_io_methods *)0x0) {
    return -1;
  }
  pFile[5].pMethods = puVar8;
LAB_0010f6a8:
  local_e0 = pFile + 5;
  iVar13 = (flags & 4) * 0x10;
  iVar4 = iVar13 + 0x20080;
  if ((flags & 8) == 0) {
    iVar4 = iVar13;
  }
  uVar12 = 0x180;
  if ((flags & 0x10) == 0) {
    uVar12 = 0x1a4;
  }
  iVar4 = open(zPath,iVar4 + (flags & 2),uVar12);
  if (iVar4 < 0) {
    iVar13 = -2;
    goto LAB_0010f7f5;
  }
  puVar8 = local_e0->pMethods;
  if (puVar8 != (unqlite_io_methods *)0x0) goto LAB_0010f6f2;
  goto LAB_0010f6f8;
  while (*(uint *)&puVar8->field_0x4 != flags) {
LAB_0010f8df:
    puVar10 = puVar8;
    puVar8 = (unqlite_io_methods *)puVar10->xClose;
    if (puVar8 == (unqlite_io_methods *)0x0) goto LAB_0010f679;
  }
  ppUVar11 = (UnixUnusedFd **)&puVar10->xClose;
LAB_0010f8f8:
  *ppUVar11 = (UnixUnusedFd *)puVar8->xClose;
  iVar4 = puVar8->iVersion;
  local_e0 = pFile + 5;
  pFile[5].pMethods = puVar8;
  if (iVar4 < 0) goto LAB_0010f6a8;
LAB_0010f6f2:
  puVar8->iVersion = iVar4;
  *(uint *)&puVar8->field_0x4 = flags;
LAB_0010f6f8:
  local_e5 = (flags & 4) == 0;
  if ((flags & 0x10) != 0) {
    unlink(zPath);
  }
  if ((local_e5) || (iVar13 = openDirectory(zPath,&local_e4), iVar13 == 0)) {
    uVar5 = fcntl(iVar4,1,0);
    fcntl(iVar4,2,(ulong)(uVar5 | 1));
    iVar3 = local_e4;
    *(int *)&pFile[2].pMethods = iVar4;
    *(int *)((long)&pFile[2].pMethods + 4) = local_e4;
    *(undefined4 *)&pFile[6].pMethods = 0;
    pFile[7].pMethods = (unqlite_io_methods *)zPath;
    iVar13 = fstat(iVar4,&local_c8);
    if (iVar13 == 0) {
      local_d8 = local_c8.st_dev;
      iStack_d0 = local_c8.st_ino;
      if (inodeList != (unixInodeInfo *)0x0) {
        puVar8 = (unqlite_io_methods *)inodeList;
        do {
          sVar6 = SyMemcmp(&local_d8,puVar8,0x10);
          if (sVar6 == 0) {
            *(int *)&puVar8->xWrite = *(int *)&puVar8->xWrite + 1;
            puVar10 = (unqlite_io_methods *)inodeList;
            goto LAB_0010f929;
          }
          puVar8 = (unqlite_io_methods *)puVar8->xSync;
        } while (puVar8 != (unqlite_io_methods *)0x0);
      }
      puVar8 = (unqlite_io_methods *)SyMemBackendAlloc(&sUnqlMPGlobal.sAllocator,0x38);
      if (puVar8 != (unqlite_io_methods *)0x0) {
        puVar8->xTruncate = (_func_int_unqlite_file_ptr_unqlite_int64 *)0x0;
        puVar8->xSync = (_func_int_unqlite_file_ptr_int *)0x0;
        puVar8->xRead = (_func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 *)0x0;
        puVar8->xWrite = (_func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 *)0x0;
        *(undefined8 *)puVar8 = 0;
        puVar8->xClose = (_func_int_unqlite_file_ptr *)0x0;
        puVar8->xFileSize = (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0;
        SyMemcpy(&local_d8,puVar8,0x10);
        *(int *)&puVar8->xWrite = 1;
        puVar8->xSync = (_func_int_unqlite_file_ptr_int *)inodeList;
        puVar8->xFileSize = (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0;
        puVar10 = puVar8;
        if (inodeList != (unixInodeInfo *)0x0) {
          inodeList->pPrev = (unixInodeInfo *)puVar8;
        }
LAB_0010f929:
        inodeList = (unixInodeInfo *)puVar10;
        pFile[1].pMethods = puVar8;
        *(undefined4 *)((long)&pFile[3].pMethods + 4) = 0;
        pFile->pMethods = &unixIoMethod;
        return 0;
      }
      iVar13 = -1;
    }
    else {
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      *(int *)((long)&pFile[3].pMethods + 4) = iVar1;
      iVar13 = -2;
      if (iVar1 == 0x4b) {
        iVar13 = -0x11;
      }
    }
    close(iVar4);
    *(undefined4 *)((long)&pFile[3].pMethods + 4) = 0;
    iVar4 = iVar3;
    if (iVar3 < 0) goto LAB_0010f7f5;
  }
  close(iVar4);
LAB_0010f7f5:
  SyMemBackendFree(&sUnqlMPGlobal.sAllocator,local_e0->pMethods);
  return iVar13;
}

Assistant:

static int unixOpen(
  unqlite_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  unqlite_file *pFile,         /* The file descriptor to be filled in */
  unsigned int flags           /* Input flags to control the opening */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int dirfd = -1;                /* Directory file descriptor */
  int openFlags = 0;             /* Flags to pass to open() */
  int noLock;                    /* True to omit locking primitives */
  int rc = UNQLITE_OK;            /* Function Return Code */
  UnixUnusedFd *pUnused;
  int isExclusive  = (flags & UNQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & UNQLITE_OPEN_TEMP_DB);
  int isCreate     = (flags & UNQLITE_OPEN_CREATE);
  int isReadonly   = (flags & UNQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & UNQLITE_OPEN_READWRITE);
  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
#ifndef UNQLITE_DISABLE_DIRSYNC
  int isOpenDirectory = isCreate;
#endif
  const char *zName = zPath;

  SyZero(p,sizeof(unixFile));
  
  pUnused = findReusableFd(zName, flags);
  if( pUnused ){
	  fd = pUnused->fd;
  }else{
	  pUnused = unqlite_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return UNQLITE_NOMEM;
      }
  }
  p->pUnused = pUnused;
  
  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    rc = findCreateFileMode(zName, flags, &openMode);
    if( rc!=UNQLITE_OK ){
      return rc;
    }
    fd = open(zName, openFlags, openMode);
    if( fd<0 ){
	  rc = UNQLITE_IOERR;
      goto open_finished;
    }
  }
  
  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
    unlink(zName);
  }

#ifndef UNQLITE_DISABLE_DIRSYNC
  if( isOpenDirectory ){
    rc = openDirectory(zPath, &dirfd);
    if( rc!=UNQLITE_OK ){
      /* It is safe to close fd at this point, because it is guaranteed not
      ** to be open on a database file. If it were open on a database file,
      ** it would not be safe to close as this would release any locks held
      ** on the file by this process.  */
      close(fd);             /* silently leak if fail, already in error */
      goto open_finished;
    }
  }
#endif

#ifdef FD_CLOEXEC
  fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif

  noLock = 0;

#if defined(__APPLE__) 
  struct statfs fsInfo;
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    if( dirfd>=0 ) close(dirfd); /* silently leak if fail, in error */
    close(fd); /* silently leak if fail, in error */
    return UNQLITE_IOERR;
  }
  if (0 == SyStrncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= UNQLITE_FSFLAGS_IS_MSDOS;
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, dirfd, pFile, zPath, noLock, isDelete);
open_finished:
  if( rc!=UNQLITE_OK ){
    unqlite_free(p->pUnused);
  }
  return rc;
}